

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

SPVFuncImpl __thiscall
spirv_cross::CompilerMSL::OpCodePreprocessor::get_spv_func_impl
          (OpCodePreprocessor *this,Op opcode,uint32_t *args)

{
  uint uVar1;
  uint32_t uVar2;
  bool bVar3;
  char cVar4;
  __node_base_ptr p_Var5;
  SPIRVariable *pSVar6;
  ulong uVar7;
  SPIRType *pSVar8;
  mapped_type *pmVar9;
  SPIRExtension *pSVar10;
  SPVFuncImpl unaff_BPL;
  _Hash_node_base *p_Var11;
  
  if (0x14f < (int)opcode) {
    if ((int)opcode < 0x1145) {
      switch(opcode) {
      case OpGroupNonUniformAllEqual:
        return SPVFuncImplSubgroupAllEqual;
      case OpGroupNonUniformBroadcast:
        return SPVFuncImplSubgroupBroadcast;
      case OpGroupNonUniformBroadcastFirst:
        return SPVFuncImplSubgroupBroadcastFirst;
      case OpGroupNonUniformBallot:
        return SPVFuncImplSubgroupBallot;
      case OpGroupNonUniformInverseBallot:
      case OpGroupNonUniformBallotBitExtract:
        return SPVFuncImplSubgroupBallotBitExtract;
      case OpGroupNonUniformBallotBitCount:
        return SPVFuncImplSubgroupBallotBitCount;
      case OpGroupNonUniformBallotFindLSB:
        return SPVFuncImplSubgroupBallotFindLSB;
      case OpGroupNonUniformBallotFindMSB:
        return SPVFuncImplSubgroupBallotFindMSB;
      case OpGroupNonUniformShuffle:
        return SPVFuncImplSubgroupShuffle;
      case OpGroupNonUniformShuffleXor:
        return SPVFuncImplSubgroupShuffleXor;
      case OpGroupNonUniformShuffleUp:
        return SPVFuncImplSubgroupShuffleUp;
      case OpGroupNonUniformShuffleDown:
        return SPVFuncImplSubgroupShuffleDown;
      case OpGroupNonUniformQuadBroadcast:
        return SPVFuncImplQuadBroadcast;
      case OpGroupNonUniformQuadSwap:
        return SPVFuncImplQuadSwap;
      }
    }
    else if ((int)opcode < 0x114e) {
      if (opcode == OpSubgroupBallotKHR) {
        return SPVFuncImplSubgroupBallot;
      }
      if (opcode == OpSubgroupFirstInvocationKHR) {
        return SPVFuncImplSubgroupBroadcastFirst;
      }
    }
    else {
      if (opcode == OpSubgroupAllEqualKHR) {
        return SPVFuncImplSubgroupAllEqual;
      }
      if (opcode == OpSubgroupReadInvocationKHR) {
        return SPVFuncImplSubgroupBroadcast;
      }
      if (opcode == OpAtomicFAddEXT) goto LAB_002ee0d9;
    }
    goto switchD_002ee196_caseD_15d;
  }
  if (0xe2 < (int)opcode) {
    if (opcode - OpAtomicLoad < 0x10) {
LAB_002ee0d9:
      uVar7 = (ulong)args[(ulong)(opcode != OpAtomicStore) * 2];
      p_Var11 = (_Hash_node_base *)0x0;
      p_Var5 = ::std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_before_node
                         (&(this->image_pointers)._M_h,
                          uVar7 % (this->image_pointers)._M_h._M_bucket_count,
                          args + (ulong)(opcode != OpAtomicStore) * 2,uVar7);
      if (p_Var5 != (__node_base_ptr)0x0) {
        p_Var11 = p_Var5->_M_nxt;
      }
      if (p_Var11 != (_Hash_node_base *)0x0) {
        pSVar6 = Variant::get<spirv_cross::SPIRVariable>
                           ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr +
                            *(uint *)((long)&p_Var11[1]._M_nxt + 4));
        uVar7 = (ulong)*(uint *)&(pSVar6->super_IVariant).field_0xc;
        if ((uVar7 != 0) &&
           (pSVar8 = Variant::get<spirv_cross::SPIRType>
                               ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                                super_VectorView<spirv_cross::Variant>.ptr + uVar7),
           (pSVar8->image).dim == Dim2D)) {
          return SPVFuncImplImage2DAtomicCoords;
        }
      }
    }
    goto switchD_002ee196_caseD_15d;
  }
  if (0x73 < (int)opcode) {
    uVar1 = opcode - OpFAdd;
    if (uVar1 < 0x13) {
      if ((0x78010U >> (uVar1 & 0x1f) & 1) == 0) {
        if ((5U >> (uVar1 & 0x1f) & 1) == 0) {
          if (uVar1 == 0xc) {
            return SPVFuncImplMod;
          }
          goto LAB_002ee419;
        }
        if (((this->compiler->msl_options).invariant_float_math != false) ||
           (bVar3 = Compiler::has_decoration
                              ((Compiler *)this->compiler,(ID)args[1],DecorationNoContraction),
           bVar3)) {
          return opcode == OpFAdd ^ SPVFuncImplFSub;
        }
      }
      else {
        if ((this->compiler->msl_options).invariant_float_math != false) {
          return SPVFuncImplFMul;
        }
        bVar3 = Compiler::has_decoration
                          ((Compiler *)this->compiler,(ID)args[1],DecorationNoContraction);
        if (bVar3) {
          return SPVFuncImplFMul;
        }
      }
    }
    else {
LAB_002ee419:
      if (opcode == OpQuantizeToF16) {
        return SPVFuncImplQuantizeToF16;
      }
    }
    goto switchD_002ee196_caseD_15d;
  }
  if (0x61 < (int)opcode) {
    if (opcode - OpImageRead < 2) {
LAB_002ee2ab:
      pmVar9 = ::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->result_types,args + (ulong)(opcode != OpImageWrite) * 2);
      if ((((ulong)*pmVar9 != 0) &&
          (pSVar8 = Variant::get<spirv_cross::SPIRType>
                              ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr + *pmVar9),
          (pSVar8->image).dim == DimBuffer)) &&
         ((this->compiler->msl_options).texture_buffer_native == false)) {
        return SPVFuncImplTexelBufferCoords;
      }
    }
    goto switchD_002ee196_caseD_15d;
  }
  if (opcode != OpExtInst) {
    if (opcode == OpTypeArray) {
      return SPVFuncImplUnsafeArray;
    }
    if (opcode == OpImageFetch) goto LAB_002ee2ab;
    goto switchD_002ee196_caseD_15d;
  }
  pSVar10 = Variant::get<spirv_cross::SPIRExtension>
                      ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + args[2]);
  if (*(int *)&(pSVar10->super_IVariant).field_0xc != 1) {
    bVar3 = false;
    goto LAB_002ee530;
  }
  uVar2 = args[3];
  cVar4 = '\x01';
  if ((int)uVar2 < 0x22) {
    if (uVar2 == 7) {
      unaff_BPL = SPVFuncImplSSign;
    }
    else if (uVar2 == 0xb) {
      unaff_BPL = SPVFuncImplRadians;
    }
    else {
      if (uVar2 != 0xc) goto LAB_002ee528;
      unaff_BPL = SPVFuncImplDegrees;
    }
    goto LAB_002ee52a;
  }
  switch(uVar2) {
  case 0x46:
    pSVar8 = Variant::get<spirv_cross::SPIRType>
                       ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + *args);
    bVar3 = pSVar8->vecsize != 1;
    unaff_BPL = SPVFuncImplFaceForwardScalar;
    if (bVar3) goto LAB_002ee528;
    goto LAB_002ee501;
  case 0x47:
    pSVar8 = Variant::get<spirv_cross::SPIRType>
                       ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + *args);
    uVar2 = pSVar8->vecsize;
    unaff_BPL = SPVFuncImplReflectScalar;
    goto joined_r0x002ee4d2;
  case 0x48:
    pSVar8 = Variant::get<spirv_cross::SPIRType>
                       ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + *args);
    uVar2 = pSVar8->vecsize;
    unaff_BPL = SPVFuncImplRefractScalar;
joined_r0x002ee4d2:
    bVar3 = uVar2 != 1;
    if (bVar3) {
LAB_002ee528:
      cVar4 = '\0';
    }
    else {
LAB_002ee501:
      cVar4 = bVar3 * '\x02' + '\x01';
    }
    break;
  case 0x49:
    unaff_BPL = SPVFuncImplFindILsb;
    break;
  case 0x4a:
    unaff_BPL = SPVFuncImplFindSMsb;
    break;
  case 0x4b:
    unaff_BPL = SPVFuncImplFindUMsb;
    break;
  default:
    if (uVar2 != 0x22) goto LAB_002ee528;
    pSVar8 = Variant::get<spirv_cross::SPIRType>
                       ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + *args);
    uVar2 = pSVar8->columns;
    cVar4 = '\x01';
    if (uVar2 == 2) {
      unaff_BPL = SPVFuncImplInverse2x2;
LAB_002ee519:
      bVar3 = false;
    }
    else {
      if (uVar2 == 4) {
        unaff_BPL = SPVFuncImplInverse4x4;
        goto LAB_002ee519;
      }
      if (uVar2 == 3) {
        unaff_BPL = SPVFuncImplInverse3x3;
        goto LAB_002ee519;
      }
      cVar4 = '\x03';
      bVar3 = true;
    }
    if (bVar3) goto LAB_002ee528;
  }
LAB_002ee52a:
  bVar3 = cVar4 == '\x01';
LAB_002ee530:
  if (!bVar3) {
switchD_002ee196_caseD_15d:
    unaff_BPL = SPVFuncImplNone;
  }
  return unaff_BPL;
}

Assistant:

CompilerMSL::SPVFuncImpl CompilerMSL::OpCodePreprocessor::get_spv_func_impl(Op opcode, const uint32_t *args)
{
	switch (opcode)
	{
	case OpFMod:
		return SPVFuncImplMod;

	case OpFAdd:
	case OpFSub:
		if (compiler.msl_options.invariant_float_math ||
		    compiler.has_decoration(args[1], DecorationNoContraction))
		{
			return opcode == OpFAdd ? SPVFuncImplFAdd : SPVFuncImplFSub;
		}
		break;

	case OpFMul:
	case OpOuterProduct:
	case OpMatrixTimesVector:
	case OpVectorTimesMatrix:
	case OpMatrixTimesMatrix:
		if (compiler.msl_options.invariant_float_math ||
		    compiler.has_decoration(args[1], DecorationNoContraction))
		{
			return SPVFuncImplFMul;
		}
		break;

	case OpQuantizeToF16:
		return SPVFuncImplQuantizeToF16;

	case OpTypeArray:
	{
		// Allow Metal to use the array<T> template to make arrays a value type
		return SPVFuncImplUnsafeArray;
	}

	// Emulate texture2D atomic operations
	case OpAtomicExchange:
	case OpAtomicCompareExchange:
	case OpAtomicCompareExchangeWeak:
	case OpAtomicIIncrement:
	case OpAtomicIDecrement:
	case OpAtomicIAdd:
	case OpAtomicFAddEXT:
	case OpAtomicISub:
	case OpAtomicSMin:
	case OpAtomicUMin:
	case OpAtomicSMax:
	case OpAtomicUMax:
	case OpAtomicAnd:
	case OpAtomicOr:
	case OpAtomicXor:
	case OpAtomicLoad:
	case OpAtomicStore:
	{
		auto it = image_pointers.find(args[opcode == OpAtomicStore ? 0 : 2]);
		if (it != image_pointers.end())
		{
			uint32_t tid = compiler.get<SPIRVariable>(it->second).basetype;
			if (tid && compiler.get<SPIRType>(tid).image.dim == Dim2D)
				return SPVFuncImplImage2DAtomicCoords;
		}
		break;
	}

	case OpImageFetch:
	case OpImageRead:
	case OpImageWrite:
	{
		// Retrieve the image type, and if it's a Buffer, emit a texel coordinate function
		uint32_t tid = result_types[args[opcode == OpImageWrite ? 0 : 2]];
		if (tid && compiler.get<SPIRType>(tid).image.dim == DimBuffer && !compiler.msl_options.texture_buffer_native)
			return SPVFuncImplTexelBufferCoords;
		break;
	}

	case OpExtInst:
	{
		uint32_t extension_set = args[2];
		if (compiler.get<SPIRExtension>(extension_set).ext == SPIRExtension::GLSL)
		{
			auto op_450 = static_cast<GLSLstd450>(args[3]);
			switch (op_450)
			{
			case GLSLstd450Radians:
				return SPVFuncImplRadians;
			case GLSLstd450Degrees:
				return SPVFuncImplDegrees;
			case GLSLstd450FindILsb:
				return SPVFuncImplFindILsb;
			case GLSLstd450FindSMsb:
				return SPVFuncImplFindSMsb;
			case GLSLstd450FindUMsb:
				return SPVFuncImplFindUMsb;
			case GLSLstd450SSign:
				return SPVFuncImplSSign;
			case GLSLstd450Reflect:
			{
				auto &type = compiler.get<SPIRType>(args[0]);
				if (type.vecsize == 1)
					return SPVFuncImplReflectScalar;
				break;
			}
			case GLSLstd450Refract:
			{
				auto &type = compiler.get<SPIRType>(args[0]);
				if (type.vecsize == 1)
					return SPVFuncImplRefractScalar;
				break;
			}
			case GLSLstd450FaceForward:
			{
				auto &type = compiler.get<SPIRType>(args[0]);
				if (type.vecsize == 1)
					return SPVFuncImplFaceForwardScalar;
				break;
			}
			case GLSLstd450MatrixInverse:
			{
				auto &mat_type = compiler.get<SPIRType>(args[0]);
				switch (mat_type.columns)
				{
				case 2:
					return SPVFuncImplInverse2x2;
				case 3:
					return SPVFuncImplInverse3x3;
				case 4:
					return SPVFuncImplInverse4x4;
				default:
					break;
				}
				break;
			}
			default:
				break;
			}
		}
		break;
	}

	case OpGroupNonUniformBroadcast:
	case OpSubgroupReadInvocationKHR:
		return SPVFuncImplSubgroupBroadcast;

	case OpGroupNonUniformBroadcastFirst:
	case OpSubgroupFirstInvocationKHR:
		return SPVFuncImplSubgroupBroadcastFirst;

	case OpGroupNonUniformBallot:
	case OpSubgroupBallotKHR:
		return SPVFuncImplSubgroupBallot;

	case OpGroupNonUniformInverseBallot:
	case OpGroupNonUniformBallotBitExtract:
		return SPVFuncImplSubgroupBallotBitExtract;

	case OpGroupNonUniformBallotFindLSB:
		return SPVFuncImplSubgroupBallotFindLSB;

	case OpGroupNonUniformBallotFindMSB:
		return SPVFuncImplSubgroupBallotFindMSB;

	case OpGroupNonUniformBallotBitCount:
		return SPVFuncImplSubgroupBallotBitCount;

	case OpGroupNonUniformAllEqual:
	case OpSubgroupAllEqualKHR:
		return SPVFuncImplSubgroupAllEqual;

	case OpGroupNonUniformShuffle:
		return SPVFuncImplSubgroupShuffle;

	case OpGroupNonUniformShuffleXor:
		return SPVFuncImplSubgroupShuffleXor;

	case OpGroupNonUniformShuffleUp:
		return SPVFuncImplSubgroupShuffleUp;

	case OpGroupNonUniformShuffleDown:
		return SPVFuncImplSubgroupShuffleDown;

	case OpGroupNonUniformQuadBroadcast:
		return SPVFuncImplQuadBroadcast;

	case OpGroupNonUniformQuadSwap:
		return SPVFuncImplQuadSwap;

	default:
		break;
	}
	return SPVFuncImplNone;
}